

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::
     TupleMatches<std::tuple<testing::Matcher<TestPLTermBuilder>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<TestPLTermBuilder,BasicTestExpr<1>>>
               (tuple<testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_>
                *matcher_tuple,tuple<TestPLTermBuilder,_BasicTestExpr<1>_> *value_tuple)

{
  bool bVar1;
  tuple<TestPLTermBuilder,_BasicTestExpr<1>_> *in_RDI;
  tuple<testing::Matcher<TestPLTermBuilder>,_testing::Matcher<BasicTestExpr<1>_>_> *unaff_retaddr;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<TestPLTermBuilder>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<TestPLTermBuilder,BasicTestExpr<1>>>
                    (unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool TupleMatches(const MatcherTuple& matcher_tuple,
                  const ValueTuple& value_tuple) {
  using ::std::tr1::tuple_size;
  // Makes sure that matcher_tuple and value_tuple have the same
  // number of fields.
  GTEST_COMPILE_ASSERT_(tuple_size<MatcherTuple>::value ==
                        tuple_size<ValueTuple>::value,
                        matcher_and_value_have_different_numbers_of_fields);
  return TuplePrefix<tuple_size<ValueTuple>::value>::
      Matches(matcher_tuple, value_tuple);
}